

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::changeColsCost(Highs *this,HighsInt from_col,HighsInt to_col,double *cost)

{
  HighsInt HVar1;
  HighsStatus HVar2;
  allocator local_f1;
  string local_f0;
  HighsIndexCollection index_collection;
  HighsLogOptions local_80;
  
  clearDerivedModelProperties(this);
  index_collection.dimension_ = -1;
  index_collection.is_interval_ = false;
  index_collection.from_ = -1;
  index_collection.to_ = -2;
  index_collection.is_set_ = false;
  index_collection.set_num_entries_ = -1;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  index_collection._41_8_ = 0;
  HVar1 = create(&index_collection,from_col,to_col,(this->model_).lp_.num_col_);
  if (HVar1 == 0) {
    HVar2 = changeCostsInterface(this,&index_collection,cost);
    HighsLogOptions::HighsLogOptions
              (&local_80,&(this->options_).super_HighsOptionsStruct.log_options);
    std::__cxx11::string::string((string *)&local_f0,"changeCosts",&local_f1);
    HVar2 = interpretCallStatus(&local_80,HVar2,kOk,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::_Function_base::~_Function_base(&local_80.user_callback.super__Function_base);
    if (HVar2 != kError) {
      HVar2 = returnFromHighs(this,HVar2);
      goto LAB_0023876a;
    }
  }
  else {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Interval [%d, %d] supplied to Highs::changeColsCost is out of range [0, %d)\n",
                 (ulong)(uint)from_col,(ulong)(uint)to_col,(ulong)(uint)(this->model_).lp_.num_col_)
    ;
  }
  HVar2 = kError;
LAB_0023876a:
  HighsIndexCollection::~HighsIndexCollection(&index_collection);
  return HVar2;
}

Assistant:

HighsStatus Highs::changeColsCost(const HighsInt from_col,
                                  const HighsInt to_col, const double* cost) {
  clearDerivedModelProperties();
  HighsIndexCollection index_collection;
  const HighsInt create_error =
      create(index_collection, from_col, to_col, model_.lp_.num_col_);
  if (create_error) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Interval [%d, %d] supplied to Highs::changeColsCost is out "
                 "of range [0, %d)\n",
                 int(from_col), int(to_col), int(model_.lp_.num_col_));
    return HighsStatus::kError;
  }
  HighsStatus call_status = changeCostsInterface(index_collection, cost);
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "changeCosts");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}